

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O1

void __thiscall Start::StartGameNow(Start *this,double *credits,uint *bet)

{
  double dVar1;
  pointer piVar2;
  pointer pvVar3;
  pointer pvVar4;
  int iVar5;
  ostream *poVar6;
  Start *this_00;
  pointer pvVar7;
  string p;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myVectorInStart;
  CreditField addCreditBeforeExit;
  Bet settingBet;
  PaytableSuperFire paytableForGame;
  undefined1 local_f8 [32];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_d8;
  Start *local_c0;
  CreditField local_b8;
  SelectGame local_b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_90;
  PaytableSuperFire local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_d8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = this;
  Matrix::getVectorMatrix
            ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_f8,&this->super_Matrix);
  local_78._myVectorInPaytableSuperFire.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78._myVectorInPaytableSuperFire.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_d8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78._myVectorInPaytableSuperFire.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_d8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
  local_d8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._8_8_;
  local_d8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._16_8_;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (pointer)0x0;
  local_f8._16_8_ = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_78._myVectorInPaytableSuperFire);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_f8);
  local_f8._0_8_ = local_f8 + 0x10;
  local_f8._8_8_ = (pointer)0x0;
  local_f8._16_8_ = local_f8._16_8_ & 0xffffffffffffff00;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_90,&local_d8);
  PaytableSuperFire::PaytableSuperFire(&local_78,&local_90,*credits,*bet);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_90);
  dVar1 = *credits;
  while (1.0 <= dVar1) {
    if (dVar1 < (double)*bet) {
      *bet = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Changing Bet to min: ",0x15);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," Euro!",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "********************************************************************************************************************"
               ,0x74);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'p\' to Start a Game!",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'e\' to Change the Bet!",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'i\' to see the Paytable!",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'c\' to Cashout!",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'g\' to see the Gamble Info Screen!",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'a\' to add credit!",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'q\' for More Games!",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Current Credit: ",0x10);
    poVar6 = std::ostream::_M_insert<double>(*credits);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Euro!",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "********************************************************************************************************************"
               ,0x74);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)local_f8);
    if ((*(char *)&(((_Vector_base<int,_std::allocator<int>_> *)local_f8._0_8_)->_M_impl).
                   super__Vector_impl_data._M_start == 'p') &&
       ((pointer)local_f8._8_8_ == (pointer)0x1)) {
      iVar5 = system("CLS");
      if (iVar5 != 0) {
        system("clear");
      }
      *credits = *credits - (double)*bet;
      Matrix::RandomNumbersInMatrix(&local_48,&local_c0->super_Matrix,&local_d8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---------------------------------------------",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      Matrix::outPutMatrix(&local_c0->super_Matrix,&local_d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---------------------------------------------",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      this_00 = (Start *)std::ostream::put(-8);
      std::ostream::flush();
      checkForCreditsAndBet(this_00,credits,bet);
      outputCreditsAndBetCurrent(this_00,credits,bet);
      PaytableSuperFire::PaytableSuperFireWin(&local_78,&local_d8,credits,bet);
    }
    if ((*(char *)&(((_Vector_base<int,_std::allocator<int>_> *)local_f8._0_8_)->_M_impl).
                   super__Vector_impl_data._M_start == 'e') &&
       ((pointer)local_f8._8_8_ == (pointer)0x1)) {
      iVar5 = system("CLS");
      if (iVar5 != 0) {
        system("clear");
      }
      Bet::Bet((Bet *)&local_b0,*bet,*credits);
      Bet::selectBet((Bet *)&local_b0,bet,credits);
      Bet::~Bet((Bet *)&local_b0);
    }
    if ((*(char *)&(((_Vector_base<int,_std::allocator<int>_> *)local_f8._0_8_)->_M_impl).
                   super__Vector_impl_data._M_start == 'i') &&
       ((pointer)local_f8._8_8_ == (pointer)0x1)) {
      iVar5 = system("CLS");
      if (iVar5 != 0) {
        system("clear");
      }
      PaytableSuperFire::PaytableSuperFireInfo(&local_78);
    }
    if ((*(char *)&(((_Vector_base<int,_std::allocator<int>_> *)local_f8._0_8_)->_M_impl).
                   super__Vector_impl_data._M_start == 'c') &&
       ((pointer)local_f8._8_8_ == (pointer)0x1)) {
      if (*credits <= 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Nothing to cashout!",0x13);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cashout...",10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Handpay! Call Attendant! ",0x19);
        poVar6 = std::ostream::_M_insert<double>(*credits);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," Euro!",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        *credits = 0.0;
      }
    }
    if ((*(char *)&(((_Vector_base<int,_std::allocator<int>_> *)local_f8._0_8_)->_M_impl).
                   super__Vector_impl_data._M_start == 'g') &&
       ((pointer)local_f8._8_8_ == (pointer)0x1)) {
      Gamble::Gamble((Gamble *)&local_b0);
      Gamble::GambleInfoScreen((Gamble *)&local_b0);
      Gamble::~Gamble((Gamble *)&local_b0);
    }
    if ((*(char *)&(((_Vector_base<int,_std::allocator<int>_> *)local_f8._0_8_)->_M_impl).
                   super__Vector_impl_data._M_start == 'a') &&
       ((pointer)local_f8._8_8_ == (pointer)0x1)) {
      CreditField::CreditField((CreditField *)&local_b0);
      CreditField::AddCredit((CreditField *)&local_b0,credits);
      CreditField::~CreditField((CreditField *)&local_b0);
    }
    if ((*(char *)&(((_Vector_base<int,_std::allocator<int>_> *)local_f8._0_8_)->_M_impl).
                   super__Vector_impl_data._M_start == 'q') &&
       ((pointer)local_f8._8_8_ == (pointer)0x1)) {
      SelectGame::SelectGame(&local_b0);
      SelectGame::selectGame_Welcome(&local_b0);
      SelectGame::selectGame_Games(&local_b0);
      SelectGame::selectGame_Option(&local_b0,credits);
      SelectGame::~SelectGame(&local_b0);
    }
    if (*credits <= 1.0 && *credits != 1.0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No More Credits To Play on Min Bet! :(",0x26);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      CreditField::CreditField(&local_b8);
      CreditField::AddCredit(&local_b8,credits);
      if (*credits <= 1.0 && *credits != 1.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"You need to add atleast 1 Euro!",0x1f);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cashout: ",9);
        poVar6 = std::ostream::_M_insert<double>(*credits);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," Euro.",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        *credits = 0.0;
        SelectGame::SelectGame(&local_b0);
        SelectGame::selectGame_Welcome(&local_b0);
        SelectGame::selectGame_Games(&local_b0);
        SelectGame::selectGame_Option(&local_b0,credits);
        SelectGame::~SelectGame(&local_b0);
      }
      CreditField::~CreditField(&local_b8);
    }
    pvVar4 = local_d8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = local_d8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = local_d8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_d8.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_d8.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        piVar2 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar2 != (pointer)0x0) {
          operator_delete(piVar2,(long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)piVar2);
        }
        pvVar7 = pvVar7 + 1;
      } while (pvVar7 != pvVar4);
      local_d8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
    }
    dVar1 = *credits;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_78._myVectorInPaytableSuperFire);
  if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_,
                    (ulong)((long)&(((_Vector_base<int,_std::allocator<int>_> *)local_f8._16_8_)->
                                   _M_impl).super__Vector_impl_data._M_start + 1));
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_d8);
  return;
}

Assistant:

void Start::StartGameNow(double & credits, unsigned int& bet) {
	
	std::vector<std::vector<int>>myVectorInStart;
	myVectorInStart = getVectorMatrix();
	std::string p;
	
	unsigned int minBet = 1;
	PaytableSuperFire paytableForGame(myVectorInStart, credits, bet);
	while (credits >= 1) {
		if (credits < bet && credits >= 1) {
			bet = minBet;
			std::cout << "Changing Bet to min: " << bet <<" Euro!" << std::endl;
		}
			std::cout << "********************************************************************************************************************" << std::endl;
			std::cout << "Press 'p' to Start a Game!" << std::endl;
			std::cout << "Press 'e' to Change the Bet!" << std::endl;
			std::cout << "Press 'i' to see the Paytable!" << std::endl;
			std::cout << "Press 'c' to Cashout!" << std::endl;
			std::cout << "Press 'g' to see the Gamble Info Screen!" << std::endl;
			std::cout << "Press 'a' to add credit!" << std::endl;
			std::cout << "Press 'q' for More Games!" << std::endl;
			std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
			std::cout << "********************************************************************************************************************" << std::endl;
		
		std::cin >> p;
		//new code here for safety
		/*while(p.size() > 1) {
			std::cin >> p;
		}*/
		if (p[0] == 'p' && p.size()==1) {
			//clears screen
			if (system("CLS")) system("clear");

			takeCreditsWithBet(credits, bet);
			RandomNumbersInMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			outPutMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl;
			checkForCreditsAndBet(credits, bet);
			outputCreditsAndBetCurrent(credits,bet);
			paytableForGame.PaytableSuperFireWin(myVectorInStart,credits,bet);
		}
		if (p[0] == 'e' && p.size() == 1) {
			if (system("CLS")) system("clear");
			Bet settingBet(bet, credits);
			settingBet.selectBet(bet,credits );
		}
		if (p[0] == 'i' && p.size() == 1) {
			if (system("CLS")) system("clear");
			paytableForGame.PaytableSuperFireInfo();
		}
		if (p[0] == 'c' && p.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (p[0] == 'g' && p.size() == 1) {
			
			Gamble gambleInfoScreen;
			gambleInfoScreen.GambleInfoScreen();
		}
		if (p[0] == 'a' &&p.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (p[0] == 'q' && p.size() == 1) {
			SelectGame selectgame;
			selectgame.selectGame_Welcome();
			selectgame.selectGame_Games();

			//choosing a game
			selectgame.selectGame_Option(credits);
		}
	
		if (credits < 1 ) {
			std::cout << "No More Credits To Play on Min Bet! :(" << std::endl;
			CreditField addCreditBeforeExit;
			addCreditBeforeExit.AddCredit(credits);
			if (credits < 1) {
				std::cout << "You need to add atleast 1 Euro!" << std::endl;
				std::cout << "Cashout: " << credits << " Euro." << std::endl;
				credits = 0;
				//Sleep(2000);
				SelectGame selectgame;
				selectgame.selectGame_Welcome();
				selectgame.selectGame_Games();

				//choosing a game
				selectgame.selectGame_Option(credits);
			}
		}
		
		myVectorInStart.clear();
	}
}